

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-spell.c
# Opt level: O0

void spell_message(monster *mon,monster_spell *spell,_Bool seen,_Bool hits)

{
  char cVar1;
  spell_tag_t sVar2;
  ushort **ppuVar3;
  char *pcVar4;
  bool bVar5;
  char *type_name_1;
  wchar_t type_1;
  char *type_name;
  wchar_t type;
  wchar_t mdesc_mode_1;
  char m_name_1 [80];
  char m_poss [80];
  wchar_t local_4bc;
  char local_4b8 [4];
  wchar_t mdesc_mode;
  char m_name [80];
  monster_conflict *pmStack_460;
  _Bool is_leading;
  monster *t_mon;
  monster_spell_level *level;
  size_t end;
  char *in_cursor;
  char *tag;
  char *s;
  char *next;
  char buf [1024];
  char cStack_20;
  char cStack_1f;
  char cStack_1e;
  char cStack_1d;
  char cStack_1c;
  char cStack_1b;
  char punct [8];
  _Bool hits_local;
  _Bool seen_local;
  monster_spell *spell_local;
  monster *mon_local;
  
  buf[0x3fe] = '.';
  buf[0x3ff] = '!';
  cStack_20 = '?';
  cStack_1f = ';';
  cStack_1e = ':';
  cStack_1d = ',';
  cStack_1c = '\'';
  cStack_1b = '\0';
  memset(&next,0,0x400);
  level = (monster_spell_level *)0x0;
  t_mon = (monster *)spell->level;
  pmStack_460 = (monster_conflict *)0x0;
  while( true ) {
    bVar5 = false;
    if (t_mon->race != (monster_race *)0x0) {
      bVar5 = (int)t_mon->race->ridx <= mon->race->spell_power;
    }
    if (!bVar5) break;
    t_mon = (monster *)t_mon->race;
  }
  if (L'\0' < (mon->target).midx) {
    pmStack_460 = cave_monster(cave,(mon->target).midx);
  }
  if (seen) {
    if (hits) {
      end = (size_t)find_alternate_spell_message(mon->race,(uint)spell->index,MON_ALTMSG_SEEN);
      if ((char *)end == (char *)0x0) {
        end._0_4_ = t_mon->midx;
        end._4_4_ = (t_mon->grid).x;
        if (end == 0) {
          msg("No message-vis for monster spell %d cast by %s.  Please report this bug.",
              (ulong)spell->index,mon->race->name);
          return;
        }
        goto LAB_001b0462;
      }
      cVar1 = *(char *)end;
    }
    else {
      end = (size_t)find_alternate_spell_message(mon->race,(uint)spell->index,MON_ALTMSG_MISS);
      if ((char *)end == (char *)0x0) {
        end = *(size_t *)t_mon->m_timed;
        if (end == 0) {
          msg("No message-miss for monster spell %d cast by %s.  Please report this bug.",
              (ulong)spell->index,mon->race->name);
          return;
        }
        goto LAB_001b0462;
      }
      cVar1 = *(char *)end;
    }
  }
  else {
    if (pmStack_460 != (monster_conflict *)0x0) {
      return;
    }
    end = (size_t)find_alternate_spell_message(mon->race,(uint)spell->index,MON_ALTMSG_UNSEEN);
    if ((char *)end == (char *)0x0) {
      end = *(size_t *)&(t_mon->grid).y;
      if (end == 0) {
        msg("No message-invis for monster spell %d cast by %s.  Please report this bug.",
            (ulong)spell->index,mon->race->name);
        return;
      }
      goto LAB_001b0462;
    }
    cVar1 = *(char *)end;
  }
  if (cVar1 == '\0') {
    return;
  }
LAB_001b0462:
  s = strchr((char *)end,0x7b);
  m_name[0x4f] = s == (char *)end;
  while (s != (char *)0x0) {
    strnfcat((char *)&next,0x400,(size_t *)&level,"%.*s",(ulong)(uint)((int)s - (int)end),end);
    tag = s;
    do {
      tag = tag + 1;
      bVar5 = false;
      if (*tag != '\0') {
        ppuVar3 = __ctype_b_loc();
        bVar5 = ((*ppuVar3)[(int)(uint)(byte)*tag] & 0x400) != 0;
      }
    } while (bVar5);
    if (*tag == '}') {
      in_cursor = s + 1;
      end = (size_t)(tag + 1);
      sVar2 = spell_tag_lookup(in_cursor);
      switch(sVar2) {
      case SPELL_TAG_NAME:
        local_4bc = L'\x14';
        if ((m_name[0x4f] & 1U) != 0) {
          local_4bc = L'Ĕ';
        }
        pcVar4 = strchr(buf + 0x3fe,(int)*(char *)end);
        if (pcVar4 == (char *)0x0) {
          local_4bc = local_4bc | 0x200;
        }
        monster_desc(local_4b8,0x50,mon,local_4bc);
        strnfcat((char *)&next,0x400,(size_t *)&level,"%s",local_4b8);
        break;
      case SPELL_TAG_PRONOUN:
        monster_desc(m_name_1 + 0x48,0x50,mon,L'\"');
        strnfcat((char *)&next,0x400,(size_t *)&level,"%s",m_name_1 + 0x48);
        break;
      case SPELL_TAG_TARGET:
        if ((mon->target).midx < L'\x01') {
          strnfcat((char *)&next,0x400,(size_t *)&level,"you");
        }
        else {
          type_name._4_4_ = L'\x15';
          pcVar4 = strchr(buf + 0x3fe,(int)*(char *)end);
          if (pcVar4 == (char *)0x0) {
            type_name._4_4_ = L'ȕ';
          }
          monster_desc((char *)&type,0x50,(monster *)pmStack_460,type_name._4_4_);
          strnfcat((char *)&next,0x400,(size_t *)&level,"%s",&type);
        }
        break;
      case SPELL_TAG_TYPE:
        strnfcat((char *)&next,0x400,(size_t *)&level,"%s",
                 projections[mon->race->blow->effect->lash_type].lash_desc);
        break;
      case SPELL_TAG_OF_TYPE:
        pcVar4 = projections[mon->race->blow->effect->lash_type].lash_desc;
        if (pcVar4 != (char *)0x0) {
          strnfcat((char *)&next,0x400,(size_t *)&level," of ");
          strnfcat((char *)&next,0x400,(size_t *)&level,"%s",pcVar4);
        }
      }
    }
    else {
      end = (size_t)(s + 1);
    }
    s = strchr((char *)end,0x7b);
    m_name[0x4f] = '\0';
  }
  strnfcat((char *)&next,0x400,(size_t *)&level,"%s",end);
  msgt(spell->msgt,"%s",&next);
  return;
}

Assistant:

static void spell_message(struct monster *mon,
						  const struct monster_spell *spell,
						  bool seen, bool hits)
{
	const char punct[] = ".!?;:,'";
	char buf[1024] = "\0";
	const char *next;
	const char *s;
	const char *tag;
	const char *in_cursor;
	size_t end = 0;
	struct monster_spell_level *level = spell->level;
	struct monster *t_mon = NULL;
	bool is_leading;

	/* Get the right level of message */
	while (level->next && mon->race->spell_power >= level->next->power) {
		level = level->next;
	}

	/* Get the target monster, if any */
	if (mon->target.midx > 0) {
		t_mon = cave_monster(cave, mon->target.midx);
	}

	/* Get the message */
	if (!seen) {
		if (t_mon) {
			return;
		} else {
			in_cursor = find_alternate_spell_message(mon->race,
				spell->index, MON_ALTMSG_UNSEEN);
			if (in_cursor == NULL) {
				in_cursor = level->blind_message;
				if (in_cursor == NULL) {
					msg("No message-invis for monster "
						"spell %d cast by %s.  "
						"Please report this bug.",
						(int)spell->index,
						mon->race->name);
					return;
				}
			} else if (in_cursor[0] == '\0') {
				return;
			}
		}
	} else if (!hits) {
		in_cursor = find_alternate_spell_message(mon->race,
			spell->index, MON_ALTMSG_MISS);
		if (in_cursor == NULL) {
			in_cursor = level->miss_message;
			if (in_cursor == NULL) {
				msg("No message-miss for monster spell %d "
					"cast by %s.  Please report this bug.",
					(int)spell->index, mon->race->name);
				return;
			}
		} else if (in_cursor[0] == '\0') {
			return;
		}
	} else {
		in_cursor = find_alternate_spell_message(mon->race,
			spell->index, MON_ALTMSG_SEEN);
		if (in_cursor == NULL) {
			in_cursor = level->message;
			if (in_cursor == NULL) {
				msg("No message-vis for monster spell %d "
					"cast by %s.  Please report this bug.",
					(int)spell->index, mon->race->name);
				return;
			}
		} else if (in_cursor[0] == '\0') {
			return;
		}
	}

	next = strchr(in_cursor, '{');
	is_leading = (next == in_cursor);
	while (next) {
		/* Copy the text leading up to this { */
		strnfcat(buf, 1024, &end, "%.*s", (int) (next - in_cursor),
			in_cursor);

		s = next + 1;
		while (*s && isalpha((unsigned char) *s)) s++;

		/* Valid tag */
		if (*s == '}') {
			/* Start the tag after the { */
			tag = next + 1;
			in_cursor = s + 1;

			switch (spell_tag_lookup(tag)) {
				case SPELL_TAG_NAME: {
					char m_name[80];
					int mdesc_mode = (MDESC_IND_HID |
						MDESC_PRO_HID);

					if (is_leading) {
						mdesc_mode |= MDESC_CAPITAL;
					}
					if (!strchr(punct, *in_cursor)) {
						mdesc_mode |= MDESC_COMMA;
					}
					monster_desc(m_name, sizeof(m_name),
						mon, mdesc_mode);

					strnfcat(buf, sizeof(buf), &end, "%s",
						m_name);
					break;
				}

				case SPELL_TAG_PRONOUN: {
					char m_poss[80];

					/* Get the monster possessive ("his"/"her"/"its") */
					monster_desc(m_poss, sizeof(m_poss), mon, MDESC_PRO_VIS | MDESC_POSS);

					strnfcat(buf, sizeof(buf), &end, "%s",
						m_poss);
					break;
				}

				case SPELL_TAG_TARGET: {
					char m_name[80];
					if (mon->target.midx > 0) {
						int mdesc_mode = MDESC_TARG;

						if (!strchr(punct, *in_cursor)) {
							mdesc_mode |= MDESC_COMMA;
						}
						monster_desc(m_name,
							sizeof(m_name), t_mon,
							mdesc_mode);
						strnfcat(buf, sizeof(buf), &end,
							"%s", m_name);
					} else {
						strnfcat(buf, sizeof(buf), &end, "you");
					}
					break;
				}

				case SPELL_TAG_TYPE: {
					/* Get the attack type (assuming lash) */
					int type = mon->race->blow[0].effect->lash_type;
					char *type_name = projections[type].lash_desc;

					strnfcat(buf, sizeof(buf), &end, "%s",
						type_name);
					break;
				}

				case SPELL_TAG_OF_TYPE: {
					/* Get the attack type (assuming lash) */
					int type = mon->race->blow[0].effect->lash_type;
					char *type_name = projections[type].lash_desc;

					if (type_name) {
						strnfcat(buf, sizeof(buf), &end, " of ");
						strnfcat(buf, sizeof(buf), &end,
							"%s", type_name);
					}
					break;
				}

				default: {
					break;
				}
			}
		} else {
			/* An invalid tag, skip it */
			in_cursor = next + 1;
		}

		next = strchr(in_cursor, '{');
		is_leading = false;
	}
	strnfcat(buf, 1024, &end, "%s", in_cursor);

	msgt(spell->msgt, "%s", buf);
}